

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3Update(Parse *pParse,SrcList *pTabList,ExprList *pChanges,Expr *pWhere,int onError)

{
  u8 uVar1;
  sqlite3 *db;
  Index *pIVar2;
  Column *pCVar3;
  ExprList_item *pEVar4;
  sqlite3 *db_00;
  ushort uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  u32 uVar13;
  u32 uVar14;
  Table *pTab;
  Trigger *pTrigger;
  int *aChange;
  Vdbe *pVVar15;
  VTable *zP4;
  Expr *pEVar16;
  ExprList *pList;
  Select *pSVar17;
  Parse *pPVar18;
  WhereInfo *pWInfo;
  Index **ppIVar19;
  KeyInfo *zP4_00;
  Index **ppIVar20;
  int iVar21;
  char *pcVar22;
  long lVar23;
  int iVar24;
  uint uVar25;
  uint uVar26;
  Index **ppIVar27;
  int *piVar28;
  ulong uVar29;
  int *aRegIdx;
  long lVar30;
  bool bVar31;
  Expr *local_108;
  int local_ac;
  int tmask;
  Select *local_a0;
  char *local_98;
  int local_8c;
  ulong local_88;
  Parse *local_80;
  SelectDest local_78;
  NameContext local_68;
  
  db = pParse->db;
  if (((pParse->nErr != 0) || (db->mallocFailed != '\0')) ||
     (pTab = sqlite3SrcListLookup(pParse,pTabList), pTab == (Table *)0x0)) {
    aRegIdx = (int *)0x0;
    aChange = (int *)0x0;
    goto LAB_00148f71;
  }
  iVar6 = sqlite3SchemaToIndex(pParse->db,pTab->pSchema);
  pTrigger = sqlite3TriggersExist(pParse,pTab,0x6b,pChanges,&tmask);
  pSVar17 = pTab->pSelect;
  iVar7 = sqlite3ViewGetColumnNames(pParse,pTab);
  if ((iVar7 != 0) || (local_a0 = pSVar17, iVar7 = sqlite3IsReadOnly(pParse,pTab,tmask), iVar7 != 0)
     ) {
    aRegIdx = (int *)0x0;
    aChange = (int *)0x0;
    goto LAB_00148f71;
  }
  aChange = (int *)sqlite3DbMallocRaw(db,(int)pTab->nCol << 2);
  uVar29 = 0;
  if (aChange == (int *)0x0) {
    aChange = (int *)0x0;
LAB_0014929e:
    aRegIdx = (int *)0x0;
  }
  else {
    uVar5 = pTab->nCol;
    if ((short)uVar5 < 1) {
      uVar5 = 0;
    }
    for (; uVar5 != uVar29; uVar29 = uVar29 + 1) {
      aChange[uVar29] = -1;
    }
    iVar7 = pParse->nTab;
    iVar21 = iVar7 + 1;
    pParse->nTab = iVar21;
    pTabList->a[0].iCursor = iVar7;
    iVar8 = iVar7 + 2;
    ppIVar20 = &pTab->pIndex;
    ppIVar19 = ppIVar20;
    while (pIVar2 = *ppIVar19, pIVar2 != (Index *)0x0) {
      pParse->nTab = iVar8;
      iVar8 = iVar8 + 1;
      ppIVar19 = &pIVar2->pNext;
    }
    local_68.pNext = (NameContext *)0x0;
    local_68.nRef = 0;
    local_68.nErr = 0;
    local_68.pEList = (ExprList *)0x0;
    local_68.pAggInfo = (AggInfo *)0x0;
    local_68.ncFlags = '\0';
    local_68._49_7_ = 0;
    local_108 = (Expr *)0x0;
    iVar8 = 0;
    local_68.pParse = pParse;
    local_68.pSrcList = pTabList;
    for (lVar23 = 0; aRegIdx = (int *)0x0, lVar23 < pChanges->nExpr; lVar23 = lVar23 + 1) {
      iVar9 = sqlite3ResolveExprNames(&local_68,pChanges->a[lVar23].pExpr);
      if (iVar9 != 0) goto LAB_00148f71;
      uVar5 = pTab->nCol;
      if ((short)uVar5 < 1) {
        uVar5 = 0;
      }
      for (uVar29 = 0; uVar29 != uVar5; uVar29 = uVar29 + 1) {
        pCVar3 = pTab->aCol;
        pEVar4 = pChanges->a;
        iVar9 = sqlite3_stricmp(pCVar3[uVar29].zName,pEVar4[lVar23].zName);
        if (iVar9 == 0) {
          if (uVar29 == (long)pTab->iPKey) {
            local_108 = pEVar4[lVar23].pExpr;
            iVar8 = 1;
          }
          aChange[uVar29] = (int)lVar23;
          uVar29 = uVar29 & 0xffffffff;
          pcVar22 = pCVar3[uVar29].zName;
          goto LAB_00149244;
        }
      }
      pEVar4 = pChanges->a;
      pcVar22 = pEVar4[lVar23].zName;
      iVar8 = sqlite3IsRowid(pcVar22);
      if (iVar8 == 0) {
        aRegIdx = (int *)0x0;
        sqlite3ErrorMsg(pParse,"no such column: %s",pcVar22);
        pParse->checkSchema = '\x01';
        goto LAB_00148f71;
      }
      local_108 = pEVar4[lVar23].pExpr;
      uVar29 = 0xffffffffffffffff;
      iVar8 = 1;
      pcVar22 = "ROWID";
LAB_00149244:
      iVar9 = sqlite3AuthCheck(pParse,0x17,pTab->zName,pcVar22,db->aDb[iVar6].zName);
      aRegIdx = (int *)0x0;
      if (iVar9 == 2) {
        aChange[uVar29] = -1;
      }
      else if (iVar9 == 1) goto LAB_00148f71;
    }
    iVar9 = sqlite3FkRequired(pParse,pTab,aChange,iVar8);
    iVar10 = 0;
    iVar24 = 0;
    for (ppIVar19 = ppIVar20; *ppIVar19 != (Index *)0x0; ppIVar19 = &(*ppIVar19)->pNext) {
      iVar24 = iVar24 + 8;
      iVar10 = iVar10 + -1;
    }
    if (iVar10 == 0) {
      aRegIdx = (int *)0x0;
    }
    else {
      aRegIdx = (int *)sqlite3DbMallocRaw(db,iVar24);
      if (aRegIdx == (int *)0x0) goto LAB_0014929e;
    }
    lVar23 = 0;
    ppIVar19 = ppIVar20;
    while (pIVar2 = *ppIVar19, pIVar2 != (Index *)0x0) {
      if (iVar9 == 0 && iVar8 == 0) {
        uVar29 = 0;
        do {
          if (pIVar2->nColumn == uVar29) {
            iVar10 = 0;
            goto LAB_0014936d;
          }
          piVar28 = pIVar2->aiColumn + uVar29;
          uVar29 = uVar29 + 1;
        } while (aChange[*piVar28] < 0);
      }
      iVar10 = pParse->nMem + 1;
      pParse->nMem = iVar10;
LAB_0014936d:
      aRegIdx[lVar23] = iVar10;
      lVar23 = lVar23 + 1;
      ppIVar19 = &pIVar2->pNext;
    }
    pVVar15 = sqlite3GetVdbe(pParse);
    if (pVVar15 != (Vdbe *)0x0) {
      if (pParse->nested == '\0') {
        pVVar15->field_0x9a = pVVar15->field_0x9a | 0x10;
      }
      sqlite3BeginWriteOperation(pParse,1,iVar6);
      if ((pTab->tabFlags & 0x10) == 0) {
        iVar10 = pParse->nMem;
        uVar25 = iVar10 + 2;
        if ((pTrigger != (Trigger *)0x0) || (local_8c = 0, uVar26 = uVar25, iVar9 != 0)) {
          local_8c = iVar10 + 3;
          uVar26 = (int)pTab->nCol + uVar25;
        }
        uVar12 = uVar26;
        if ((iVar8 != 0 || pTrigger != (Trigger *)0x0) || iVar9 != 0) {
          uVar12 = uVar26 + 1;
        }
        local_88 = (ulong)uVar12;
        uVar26 = uVar26 + 1;
        if ((iVar8 == 0 && pTrigger == (Trigger *)0x0) && iVar9 == 0) {
          uVar26 = uVar25;
        }
        pParse->nMem = (int)pTab->nCol + uVar12;
        if (local_a0 == (Select *)0x0) {
          local_98 = (char *)0x0;
          local_80 = (Parse *)0x0;
        }
        else {
          local_98 = pParse->zAuthContext;
          pParse->zAuthContext = pTab->zName;
          sqlite3MaterializeView(pParse,pTab,pWhere,iVar7);
          local_80 = pParse;
        }
        iVar24 = sqlite3ResolveExprNames(&local_68,pWhere);
        pcVar22 = local_98;
        if (iVar24 == 0) {
          iVar10 = iVar10 + 1;
          sqlite3VdbeAddOp3(pVVar15,10,0,iVar10,uVar25);
          pWInfo = sqlite3WhereBegin(pParse,pTabList,pWhere,(ExprList *)0x0,(ExprList *)0x0,4,0);
          if (pWInfo != (WhereInfo *)0x0) {
            uVar1 = pWInfo->okOnePass;
            sqlite3VdbeAddOp2(pVVar15,0x41,iVar7,uVar25);
            if (uVar1 == '\0') {
              sqlite3VdbeAddOp2(pVVar15,0x70,iVar10,uVar25);
            }
            sqlite3WhereEnd(pWInfo);
            local_ac = 0;
            if (((db->flags & 0x10) != 0) && (pParse->pTriggerTab == (Table *)0x0)) {
              local_ac = pParse->nMem + 1;
              pParse->nMem = local_ac;
              sqlite3VdbeAddOp2(pVVar15,7,0,local_ac);
            }
            bVar31 = true;
            if (local_a0 == (Select *)0x0) {
              if (uVar1 == '\0') {
                sqlite3OpenTable(pParse,iVar7,iVar6,pTab,0x28);
              }
              ppIVar19 = ppIVar20;
              ppIVar27 = ppIVar20;
              piVar28 = aRegIdx;
              if (onError == 5) {
                bVar31 = false;
              }
              else {
                do {
                  pIVar2 = *ppIVar19;
                  bVar31 = pIVar2 == (Index *)0x0;
                  if (bVar31) break;
                  ppIVar19 = &pIVar2->pNext;
                } while (pIVar2->onError != '\x05');
              }
              while (pIVar2 = *ppIVar27, pIVar2 != (Index *)0x0) {
                if ((!bVar31) || (0 < *piVar28)) {
                  zP4_00 = sqlite3IndexKeyinfo(pParse,pIVar2);
                  sqlite3VdbeAddOp4(pVVar15,0x28,iVar21,pIVar2->tnum,iVar6,(char *)zP4_00,-0x10);
                }
                iVar21 = iVar21 + 1;
                piVar28 = piVar28 + 1;
                ppIVar27 = &pIVar2->pNext;
              }
            }
            if (uVar1 == '\0') {
              uVar12 = sqlite3VdbeAddOp3(pVVar15,0x71,iVar10,0,uVar25);
            }
            else {
              uVar11 = sqlite3VdbeAddOp1(pVVar15,0x4a,uVar25);
              uVar12 = sqlite3VdbeAddOp0(pVVar15,1);
              if ((-1 < (int)uVar11) && (uVar11 < (uint)pVVar15->nOp)) {
                pVVar15->aOp[uVar11].p2 = pVVar15->nOp;
              }
            }
            sqlite3VdbeAddOp3(pVVar15,0x36,iVar7,uVar12,uVar25);
            if (iVar8 != 0) {
              sqlite3ExprCode(pParse,local_108,uVar26);
              sqlite3VdbeAddOp1(pVVar15,0x15,uVar26);
            }
            iVar6 = (int)local_88 + 1;
            if ((pTrigger != (Trigger *)0x0) || (iVar9 != 0)) {
              if (iVar9 == 0) {
                uVar13 = 0;
              }
              else {
                uVar13 = sqlite3FkOldmask(pParse,pTab);
              }
              uVar14 = sqlite3TriggerColmask(pParse,pTrigger,pChanges,0,3,pTab,onError);
              iVar21 = local_8c;
              for (uVar29 = 0; (long)uVar29 < (long)pTab->nCol; uVar29 = uVar29 + 1) {
                uVar11 = (uint)uVar29;
                if (((aChange[uVar29] < 0) || ((uVar14 | uVar13) == 0xffffffff)) ||
                   ((uVar29 < 0x20 && (((uVar14 | uVar13) >> (uVar11 & 0x1f) & 1) != 0)))) {
                  sqlite3ExprCodeGetColumnOfTable(pVVar15,pTab,iVar7,uVar11,iVar21 + uVar11);
                }
                else {
                  sqlite3VdbeAddOp2(pVVar15,10,0,iVar21 + uVar11);
                }
              }
              if (iVar8 == 0) {
                sqlite3VdbeAddOp2(pVVar15,0xe,uVar25,uVar26);
              }
            }
            uVar13 = sqlite3TriggerColmask(pParse,pTrigger,pChanges,1,1,pTab,onError);
            sqlite3VdbeAddOp3(pVVar15,10,0,iVar6,(int)local_88 + (int)pTab->nCol);
            for (uVar29 = 0; (long)uVar29 < (long)pTab->nCol; uVar29 = uVar29 + 1) {
              if (uVar29 != (uint)(int)pTab->iPKey) {
                uVar11 = (uint)uVar29;
                if ((long)aChange[uVar29] < 0) {
                  if (((0x1f < uVar29) || ((tmask & 1U) == 0)) ||
                     ((uVar13 >> (uVar11 & 0x1f) & 1) != 0)) {
                    sqlite3VdbeAddOp3(pVVar15,0x1d,iVar7,uVar11,iVar6 + uVar11);
                    sqlite3ColumnDefault(pVVar15,pTab,uVar11,iVar6 + uVar11);
                  }
                }
                else {
                  sqlite3ExprCode(pParse,pChanges->a[aChange[uVar29]].pExpr,uVar11 + iVar6);
                }
              }
            }
            if ((tmask & 1U) != 0) {
              sqlite3VdbeAddOp2(pVVar15,0x1e,iVar6,(int)pTab->nCol);
              sqlite3TableAffinityStr(pVVar15,pTab);
              sqlite3CodeRowTrigger(pParse,pTrigger,0x6b,pChanges,1,pTab,uVar25,onError,uVar12);
              sqlite3VdbeAddOp3(pVVar15,0x36,iVar7,uVar12,uVar25);
              for (uVar29 = 0; (long)uVar29 < (long)pTab->nCol; uVar29 = uVar29 + 1) {
                if ((aChange[uVar29] < 0) && (uVar29 != (uint)(int)pTab->iPKey)) {
                  iVar21 = (int)uVar29;
                  sqlite3VdbeAddOp3(pVVar15,0x1d,iVar7,iVar21,iVar6 + iVar21);
                  sqlite3ColumnDefault(pVVar15,pTab,iVar21,iVar6 + iVar21);
                }
              }
            }
            if (local_a0 == (Select *)0x0) {
              uVar11 = uVar25;
              if (iVar8 == 0) {
                uVar11 = 0;
              }
              sqlite3GenerateConstraintChecks
                        (pParse,pTab,iVar7,uVar26,aRegIdx,uVar11,1,onError,uVar12,(int *)0x0);
              if (iVar9 != 0) {
                sqlite3FkCheck(pParse,pTab,uVar25,0);
              }
              uVar11 = sqlite3VdbeAddOp3(pVVar15,0x36,iVar7,0,uVar25);
              sqlite3GenerateRowIndexDelete(pParse,pTab,iVar7,aRegIdx);
              if (iVar8 != 0 || iVar9 != 0) {
                sqlite3VdbeAddOp2(pVVar15,0x3b,iVar7,0);
              }
              if ((-1 < (int)uVar11) && (uVar11 < (uint)pVVar15->nOp)) {
                pVVar15->aOp[uVar11].p2 = pVVar15->nOp;
              }
              if (iVar9 == 0) {
                sqlite3CompleteInsertion(pParse,pTab,iVar7,uVar26,aRegIdx,1,0,0);
              }
              else {
                sqlite3FkCheck(pParse,pTab,0,uVar26);
                sqlite3CompleteInsertion(pParse,pTab,iVar7,uVar26,aRegIdx,1,0,0);
                sqlite3FkActions(pParse,pTab,pChanges,uVar25);
              }
            }
            if (((db->flags & 0x10) != 0) && (pParse->pTriggerTab == (Table *)0x0)) {
              sqlite3VdbeAddOp2(pVVar15,0x14,local_ac,1);
            }
            sqlite3CodeRowTrigger(pParse,pTrigger,0x6b,pChanges,2,pTab,uVar25,onError,uVar12);
            sqlite3VdbeAddOp2(pVVar15,1,0,uVar12);
            piVar28 = aRegIdx;
            iVar6 = iVar7;
            if ((-1 < (int)uVar12) && (uVar12 < (uint)pVVar15->nOp)) {
              pVVar15->aOp[uVar12].p2 = pVVar15->nOp;
            }
            while( true ) {
              pIVar2 = *ppIVar20;
              if (pIVar2 == (Index *)0x0) break;
              if ((!bVar31) || (0 < *piVar28)) {
                sqlite3VdbeAddOp2(pVVar15,0x2d,iVar6 + 1,0);
              }
              ppIVar20 = &pIVar2->pNext;
              piVar28 = piVar28 + 1;
              iVar6 = iVar6 + 1;
            }
            sqlite3VdbeAddOp2(pVVar15,0x2d,iVar7,0);
            if ((pParse->nested == '\0') && (pParse->pTriggerTab == (Table *)0x0)) {
              sqlite3AutoincrementEnd(pParse);
            }
            pcVar22 = local_98;
            if ((((db->flags & 0x10) != 0) && (pParse->pTriggerTab == (Table *)0x0)) &&
               (pParse->nested == '\0')) {
              sqlite3VdbeAddOp2(pVVar15,0x10,local_ac,1);
              sqlite3VdbeSetNumCols(pVVar15,1);
              sqlite3VdbeSetColName(pVVar15,0,0,"rows updated",(_func_void_void_ptr *)0x0);
            }
          }
        }
        if (local_80 != (Parse *)0x0) {
          local_80->zAuthContext = pcVar22;
        }
      }
      else {
        db_00 = pParse->db;
        pVVar15 = pParse->pVdbe;
        zP4 = sqlite3GetVTable(db_00,pTab);
        pEVar16 = sqlite3Expr(db_00,0x1a,"_rowid_");
        pList = sqlite3ExprListAppend(pParse,(ExprList *)0x0,pEVar16);
        if (local_108 != (Expr *)0x0) {
          pEVar16 = sqlite3ExprDup(db_00,local_108,0);
          pList = sqlite3ExprListAppend(pParse,pList,pEVar16);
        }
        lVar30 = 0;
        for (lVar23 = 0; lVar23 < pTab->nCol; lVar23 = lVar23 + 1) {
          if ((long)aChange[lVar23] < 0) {
            pEVar16 = sqlite3Expr(db_00,0x1a,*(char **)((long)&pTab->aCol->zName + lVar30));
          }
          else {
            pEVar16 = sqlite3ExprDup(db_00,pChanges->a[aChange[lVar23]].pExpr,0);
          }
          pList = sqlite3ExprListAppend(pParse,pList,pEVar16);
          lVar30 = lVar30 + 0x30;
        }
        pSVar17 = sqlite3SelectNew(pParse,pList,pTabList,pWhere,(ExprList *)0x0,(Expr *)0x0,
                                   (ExprList *)0x0,0,(Expr *)0x0,(Expr *)0x0);
        iVar6 = pParse->nTab;
        pParse->nTab = iVar6 + 1;
        sqlite3VdbeAddOp2(pVVar15,0x2a,iVar6,(local_108 != (Expr *)0x0) + 1 + (int)pTab->nCol);
        if (pVVar15->aOp != (Op *)0x0) {
          pVVar15->aOp[(long)pVVar15->nOp + -1].p5 = '\b';
        }
        local_78.eDest = '\b';
        local_78.affSdst = '\0';
        local_78.iSdst = 0;
        local_78.nSdst = 0;
        local_78.iSDParm = iVar6;
        sqlite3Select(pParse,pSVar17,&local_78);
        iVar8 = pParse->nMem;
        local_a0 = (Select *)CONCAT44(local_a0._4_4_,iVar8 + 2);
        pParse->nMem = iVar8 + 2 + (int)pTab->nCol;
        uVar25 = sqlite3VdbeAddOp2(pVVar15,0x48,iVar6,0);
        sqlite3VdbeAddOp3(pVVar15,0x1d,iVar6,0,iVar8 + 1);
        uVar26 = (uint)(local_108 != (Expr *)0x0);
        sqlite3VdbeAddOp3(pVVar15,0x1d,iVar6,uVar26,(int)local_a0);
        for (iVar7 = 0; iVar7 < pTab->nCol; iVar7 = iVar7 + 1) {
          sqlite3VdbeAddOp3(pVVar15,0x1d,iVar6,iVar7 + uVar26 + 1,iVar7 + iVar8 + 3);
        }
        sqlite3VtabMakeWritable(pParse,pTab);
        sqlite3VdbeAddOp4(pVVar15,0x8c,0,pTab->nCol + 2,iVar8 + 1,(char *)zP4,-10);
        if (pVVar15->aOp != (Op *)0x0) {
          iVar7 = 2;
          if (onError != 99) {
            iVar7 = onError;
          }
          pVVar15->aOp[(long)pVVar15->nOp + -1].p5 = (u8)iVar7;
        }
        pPVar18 = pParse->pToplevel;
        if (pParse->pToplevel == (Parse *)0x0) {
          pPVar18 = pParse;
        }
        pPVar18->mayAbort = '\x01';
        sqlite3VdbeAddOp2(pVVar15,0x5f,iVar6,uVar25 + 1);
        if ((-1 < (int)uVar25) && (uVar25 < (uint)pVVar15->nOp)) {
          pVVar15->aOp[uVar25].p2 = pVVar15->nOp;
        }
        pTabList = (SrcList *)0x0;
        sqlite3VdbeAddOp2(pVVar15,0x2d,iVar6,0);
        sqlite3SelectDelete(db_00,pSVar17);
        pWhere = (Expr *)0x0;
      }
    }
  }
LAB_00148f71:
  sqlite3DbFree(db,aRegIdx);
  sqlite3DbFree(db,aChange);
  sqlite3SrcListDelete(db,pTabList);
  sqlite3ExprListDelete(db,pChanges);
  sqlite3ExprDelete(db,pWhere);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Update(
  Parse *pParse,         /* The parser context */
  SrcList *pTabList,     /* The table in which we should change things */
  ExprList *pChanges,    /* Things to be changed */
  Expr *pWhere,          /* The WHERE clause.  May be null */
  int onError            /* How to handle constraint errors */
){
  int i, j;              /* Loop counters */
  Table *pTab;           /* The table to be updated */
  int addr = 0;          /* VDBE instruction address of the start of the loop */
  WhereInfo *pWInfo;     /* Information about the WHERE clause */
  Vdbe *v;               /* The virtual database engine */
  Index *pIdx;           /* For looping over indices */
  int nIdx;              /* Number of indices that need updating */
  int iCur;              /* VDBE Cursor number of pTab */
  sqlite3 *db;           /* The database structure */
  int *aRegIdx = 0;      /* One register assigned to each index to be updated */
  int *aXRef = 0;        /* aXRef[i] is the index in pChanges->a[] of the
                         ** an expression for the i-th column of the table.
                         ** aXRef[i]==-1 if the i-th column is not changed. */
  int chngRowid;         /* True if the record number is being changed */
  Expr *pRowidExpr = 0;  /* Expression defining the new record number */
  int openAll = 0;       /* True if all indices need to be opened */
  AuthContext sContext;  /* The authorization context */
  NameContext sNC;       /* The name-context to resolve expressions in */
  int iDb;               /* Database containing the table being updated */
  int okOnePass;         /* True for one-pass algorithm without the FIFO */
  int hasFK;             /* True if foreign key processing is required */

#ifndef SQLITE_OMIT_TRIGGER
  int isView;            /* True when updating a view (INSTEAD OF trigger) */
  Trigger *pTrigger;     /* List of triggers on pTab, if required */
  int tmask;             /* Mask of TRIGGER_BEFORE|TRIGGER_AFTER */
#endif
  int newmask;           /* Mask of NEW.* columns accessed by BEFORE triggers */

  /* Register Allocations */
  int regRowCount = 0;   /* A count of rows changed */
  int regOldRowid;       /* The old rowid */
  int regNewRowid;       /* The new rowid */
  int regNew;            /* Content of the NEW.* table in triggers */
  int regOld = 0;        /* Content of OLD.* table in triggers */
  int regRowSet = 0;     /* Rowset of rows to be updated */

  memset(&sContext, 0, sizeof(sContext));
  db = pParse->db;
  if( pParse->nErr || db->mallocFailed ){
    goto update_cleanup;
  }
  assert( pTabList->nSrc==1 );

  /* Locate the table which we want to update. 
  */
  pTab = sqlite3SrcListLookup(pParse, pTabList);
  if( pTab==0 ) goto update_cleanup;
  iDb = sqlite3SchemaToIndex(pParse->db, pTab->pSchema);

  /* Figure out if we have any triggers and if the table being
  ** updated is a view.
  */
#ifndef SQLITE_OMIT_TRIGGER
  pTrigger = sqlite3TriggersExist(pParse, pTab, TK_UPDATE, pChanges, &tmask);
  isView = pTab->pSelect!=0;
  assert( pTrigger || tmask==0 );
#else
# define pTrigger 0
# define isView 0
# define tmask 0
#endif
#ifdef SQLITE_OMIT_VIEW
# undef isView
# define isView 0
#endif

  if( sqlite3ViewGetColumnNames(pParse, pTab) ){
    goto update_cleanup;
  }
  if( sqlite3IsReadOnly(pParse, pTab, tmask) ){
    goto update_cleanup;
  }
  aXRef = sqlite3DbMallocRaw(db, sizeof(int) * pTab->nCol );
  if( aXRef==0 ) goto update_cleanup;
  for(i=0; i<pTab->nCol; i++) aXRef[i] = -1;

  /* Allocate a cursors for the main database table and for all indices.
  ** The index cursors might not be used, but if they are used they
  ** need to occur right after the database cursor.  So go ahead and
  ** allocate enough space, just in case.
  */
  pTabList->a[0].iCursor = iCur = pParse->nTab++;
  for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
    pParse->nTab++;
  }

  /* Initialize the name-context */
  memset(&sNC, 0, sizeof(sNC));
  sNC.pParse = pParse;
  sNC.pSrcList = pTabList;

  /* Resolve the column names in all the expressions of the
  ** of the UPDATE statement.  Also find the column index
  ** for each column to be updated in the pChanges array.  For each
  ** column to be updated, make sure we have authorization to change
  ** that column.
  */
  chngRowid = 0;
  for(i=0; i<pChanges->nExpr; i++){
    if( sqlite3ResolveExprNames(&sNC, pChanges->a[i].pExpr) ){
      goto update_cleanup;
    }
    for(j=0; j<pTab->nCol; j++){
      if( sqlite3StrICmp(pTab->aCol[j].zName, pChanges->a[i].zName)==0 ){
        if( j==pTab->iPKey ){
          chngRowid = 1;
          pRowidExpr = pChanges->a[i].pExpr;
        }
        aXRef[j] = i;
        break;
      }
    }
    if( j>=pTab->nCol ){
      if( sqlite3IsRowid(pChanges->a[i].zName) ){
        j = -1;
        chngRowid = 1;
        pRowidExpr = pChanges->a[i].pExpr;
      }else{
        sqlite3ErrorMsg(pParse, "no such column: %s", pChanges->a[i].zName);
        pParse->checkSchema = 1;
        goto update_cleanup;
      }
    }
#ifndef SQLITE_OMIT_AUTHORIZATION
    {
      int rc;
      rc = sqlite3AuthCheck(pParse, SQLITE_UPDATE, pTab->zName,
                            j<0 ? "ROWID" : pTab->aCol[j].zName,
                            db->aDb[iDb].zName);
      if( rc==SQLITE_DENY ){
        goto update_cleanup;
      }else if( rc==SQLITE_IGNORE ){
        aXRef[j] = -1;
      }
    }
#endif
  }

  hasFK = sqlite3FkRequired(pParse, pTab, aXRef, chngRowid);

  /* Allocate memory for the array aRegIdx[].  There is one entry in the
  ** array for each index associated with table being updated.  Fill in
  ** the value with a register number for indices that are to be used
  ** and with zero for unused indices.
  */
  for(nIdx=0, pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext, nIdx++){}
  if( nIdx>0 ){
    aRegIdx = sqlite3DbMallocRaw(db, sizeof(Index*) * nIdx );
    if( aRegIdx==0 ) goto update_cleanup;
  }
  for(j=0, pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext, j++){
    int reg;
    if( hasFK || chngRowid ){
      reg = ++pParse->nMem;
    }else{
      reg = 0;
      for(i=0; i<pIdx->nColumn; i++){
        if( aXRef[pIdx->aiColumn[i]]>=0 ){
          reg = ++pParse->nMem;
          break;
        }
      }
    }
    aRegIdx[j] = reg;
  }

  /* Begin generating code. */
  v = sqlite3GetVdbe(pParse);
  if( v==0 ) goto update_cleanup;
  if( pParse->nested==0 ) sqlite3VdbeCountChanges(v);
  sqlite3BeginWriteOperation(pParse, 1, iDb);

#ifndef SQLITE_OMIT_VIRTUALTABLE
  /* Virtual tables must be handled separately */
  if( IsVirtual(pTab) ){
    updateVirtualTable(pParse, pTabList, pTab, pChanges, pRowidExpr, aXRef,
                       pWhere, onError);
    pWhere = 0;
    pTabList = 0;
    goto update_cleanup;
  }
#endif

  /* Allocate required registers. */
  regRowSet = ++pParse->nMem;
  regOldRowid = regNewRowid = ++pParse->nMem;
  if( pTrigger || hasFK ){
    regOld = pParse->nMem + 1;
    pParse->nMem += pTab->nCol;
  }
  if( chngRowid || pTrigger || hasFK ){
    regNewRowid = ++pParse->nMem;
  }
  regNew = pParse->nMem + 1;
  pParse->nMem += pTab->nCol;

  /* Start the view context. */
  if( isView ){
    sqlite3AuthContextPush(pParse, &sContext, pTab->zName);
  }

  /* If we are trying to update a view, realize that view into
  ** a ephemeral table.
  */
#if !defined(SQLITE_OMIT_VIEW) && !defined(SQLITE_OMIT_TRIGGER)
  if( isView ){
    sqlite3MaterializeView(pParse, pTab, pWhere, iCur);
  }
#endif

  /* Resolve the column names in all the expressions in the
  ** WHERE clause.
  */
  if( sqlite3ResolveExprNames(&sNC, pWhere) ){
    goto update_cleanup;
  }

  /* Begin the database scan
  */
  sqlite3VdbeAddOp3(v, OP_Null, 0, regRowSet, regOldRowid);
  pWInfo = sqlite3WhereBegin(
      pParse, pTabList, pWhere, 0, 0, WHERE_ONEPASS_DESIRED, 0
  );
  if( pWInfo==0 ) goto update_cleanup;
  okOnePass = pWInfo->okOnePass;

  /* Remember the rowid of every item to be updated.
  */
  sqlite3VdbeAddOp2(v, OP_Rowid, iCur, regOldRowid);
  if( !okOnePass ){
    sqlite3VdbeAddOp2(v, OP_RowSetAdd, regRowSet, regOldRowid);
  }

  /* End the database scan loop.
  */
  sqlite3WhereEnd(pWInfo);

  /* Initialize the count of updated rows
  */
  if( (db->flags & SQLITE_CountRows) && !pParse->pTriggerTab ){
    regRowCount = ++pParse->nMem;
    sqlite3VdbeAddOp2(v, OP_Integer, 0, regRowCount);
  }

  if( !isView ){
    /* 
    ** Open every index that needs updating.  Note that if any
    ** index could potentially invoke a REPLACE conflict resolution 
    ** action, then we need to open all indices because we might need
    ** to be deleting some records.
    */
    if( !okOnePass ) sqlite3OpenTable(pParse, iCur, iDb, pTab, OP_OpenWrite); 
    if( onError==OE_Replace ){
      openAll = 1;
    }else{
      openAll = 0;
      for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
        if( pIdx->onError==OE_Replace ){
          openAll = 1;
          break;
        }
      }
    }
    for(i=0, pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext, i++){
      assert( aRegIdx );
      if( openAll || aRegIdx[i]>0 ){
        KeyInfo *pKey = sqlite3IndexKeyinfo(pParse, pIdx);
        sqlite3VdbeAddOp4(v, OP_OpenWrite, iCur+i+1, pIdx->tnum, iDb,
                       (char*)pKey, P4_KEYINFO_HANDOFF);
        assert( pParse->nTab>iCur+i+1 );
      }
    }
  }

  /* Top of the update loop */
  if( okOnePass ){
    int a1 = sqlite3VdbeAddOp1(v, OP_NotNull, regOldRowid);
    addr = sqlite3VdbeAddOp0(v, OP_Goto);
    sqlite3VdbeJumpHere(v, a1);
  }else{
    addr = sqlite3VdbeAddOp3(v, OP_RowSetRead, regRowSet, 0, regOldRowid);
  }

  /* Make cursor iCur point to the record that is being updated. If
  ** this record does not exist for some reason (deleted by a trigger,
  ** for example, then jump to the next iteration of the RowSet loop.  */
  sqlite3VdbeAddOp3(v, OP_NotExists, iCur, addr, regOldRowid);

  /* If the record number will change, set register regNewRowid to
  ** contain the new value. If the record number is not being modified,
  ** then regNewRowid is the same register as regOldRowid, which is
  ** already populated.  */
  assert( chngRowid || pTrigger || hasFK || regOldRowid==regNewRowid );
  if( chngRowid ){
    sqlite3ExprCode(pParse, pRowidExpr, regNewRowid);
    sqlite3VdbeAddOp1(v, OP_MustBeInt, regNewRowid);
  }

  /* If there are triggers on this table, populate an array of registers 
  ** with the required old.* column data.  */
  if( hasFK || pTrigger ){
    u32 oldmask = (hasFK ? sqlite3FkOldmask(pParse, pTab) : 0);
    oldmask |= sqlite3TriggerColmask(pParse, 
        pTrigger, pChanges, 0, TRIGGER_BEFORE|TRIGGER_AFTER, pTab, onError
    );
    for(i=0; i<pTab->nCol; i++){
      if( aXRef[i]<0 || oldmask==0xffffffff || (i<32 && (oldmask & (1<<i))) ){
        sqlite3ExprCodeGetColumnOfTable(v, pTab, iCur, i, regOld+i);
      }else{
        sqlite3VdbeAddOp2(v, OP_Null, 0, regOld+i);
      }
    }
    if( chngRowid==0 ){
      sqlite3VdbeAddOp2(v, OP_Copy, regOldRowid, regNewRowid);
    }
  }

  /* Populate the array of registers beginning at regNew with the new
  ** row data. This array is used to check constaints, create the new
  ** table and index records, and as the values for any new.* references
  ** made by triggers.
  **
  ** If there are one or more BEFORE triggers, then do not populate the
  ** registers associated with columns that are (a) not modified by
  ** this UPDATE statement and (b) not accessed by new.* references. The
  ** values for registers not modified by the UPDATE must be reloaded from 
  ** the database after the BEFORE triggers are fired anyway (as the trigger 
  ** may have modified them). So not loading those that are not going to
  ** be used eliminates some redundant opcodes.
  */
  newmask = sqlite3TriggerColmask(
      pParse, pTrigger, pChanges, 1, TRIGGER_BEFORE, pTab, onError
  );
  sqlite3VdbeAddOp3(v, OP_Null, 0, regNew, regNew+pTab->nCol-1);
  for(i=0; i<pTab->nCol; i++){
    if( i==pTab->iPKey ){
      /*sqlite3VdbeAddOp2(v, OP_Null, 0, regNew+i);*/
    }else{
      j = aXRef[i];
      if( j>=0 ){
        sqlite3ExprCode(pParse, pChanges->a[j].pExpr, regNew+i);
      }else if( 0==(tmask&TRIGGER_BEFORE) || i>31 || (newmask&(1<<i)) ){
        /* This branch loads the value of a column that will not be changed 
        ** into a register. This is done if there are no BEFORE triggers, or
        ** if there are one or more BEFORE triggers that use this value via
        ** a new.* reference in a trigger program.
        */
        testcase( i==31 );
        testcase( i==32 );
        sqlite3VdbeAddOp3(v, OP_Column, iCur, i, regNew+i);
        sqlite3ColumnDefault(v, pTab, i, regNew+i);
      }
    }
  }

  /* Fire any BEFORE UPDATE triggers. This happens before constraints are
  ** verified. One could argue that this is wrong.
  */
  if( tmask&TRIGGER_BEFORE ){
    sqlite3VdbeAddOp2(v, OP_Affinity, regNew, pTab->nCol);
    sqlite3TableAffinityStr(v, pTab);
    sqlite3CodeRowTrigger(pParse, pTrigger, TK_UPDATE, pChanges, 
        TRIGGER_BEFORE, pTab, regOldRowid, onError, addr);

    /* The row-trigger may have deleted the row being updated. In this
    ** case, jump to the next row. No updates or AFTER triggers are 
    ** required. This behavior - what happens when the row being updated
    ** is deleted or renamed by a BEFORE trigger - is left undefined in the
    ** documentation.
    */
    sqlite3VdbeAddOp3(v, OP_NotExists, iCur, addr, regOldRowid);

    /* If it did not delete it, the row-trigger may still have modified 
    ** some of the columns of the row being updated. Load the values for 
    ** all columns not modified by the update statement into their 
    ** registers in case this has happened.
    */
    for(i=0; i<pTab->nCol; i++){
      if( aXRef[i]<0 && i!=pTab->iPKey ){
        sqlite3VdbeAddOp3(v, OP_Column, iCur, i, regNew+i);
        sqlite3ColumnDefault(v, pTab, i, regNew+i);
      }
    }
  }

  if( !isView ){
    int j1;                       /* Address of jump instruction */

    /* Do constraint checks. */
    sqlite3GenerateConstraintChecks(pParse, pTab, iCur, regNewRowid,
        aRegIdx, (chngRowid?regOldRowid:0), 1, onError, addr, 0);

    /* Do FK constraint checks. */
    if( hasFK ){
      sqlite3FkCheck(pParse, pTab, regOldRowid, 0);
    }

    /* Delete the index entries associated with the current record.  */
    j1 = sqlite3VdbeAddOp3(v, OP_NotExists, iCur, 0, regOldRowid);
    sqlite3GenerateRowIndexDelete(pParse, pTab, iCur, aRegIdx);
  
    /* If changing the record number, delete the old record.  */
    if( hasFK || chngRowid ){
      sqlite3VdbeAddOp2(v, OP_Delete, iCur, 0);
    }
    sqlite3VdbeJumpHere(v, j1);

    if( hasFK ){
      sqlite3FkCheck(pParse, pTab, 0, regNewRowid);
    }
  
    /* Insert the new index entries and the new record. */
    sqlite3CompleteInsertion(pParse, pTab, iCur, regNewRowid, aRegIdx, 1, 0, 0);

    /* Do any ON CASCADE, SET NULL or SET DEFAULT operations required to
    ** handle rows (possibly in other tables) that refer via a foreign key
    ** to the row just updated. */ 
    if( hasFK ){
      sqlite3FkActions(pParse, pTab, pChanges, regOldRowid);
    }
  }

  /* Increment the row counter 
  */
  if( (db->flags & SQLITE_CountRows) && !pParse->pTriggerTab){
    sqlite3VdbeAddOp2(v, OP_AddImm, regRowCount, 1);
  }

  sqlite3CodeRowTrigger(pParse, pTrigger, TK_UPDATE, pChanges, 
      TRIGGER_AFTER, pTab, regOldRowid, onError, addr);

  /* Repeat the above with the next record to be updated, until
  ** all record selected by the WHERE clause have been updated.
  */
  sqlite3VdbeAddOp2(v, OP_Goto, 0, addr);
  sqlite3VdbeJumpHere(v, addr);

  /* Close all tables */
  for(i=0, pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext, i++){
    assert( aRegIdx );
    if( openAll || aRegIdx[i]>0 ){
      sqlite3VdbeAddOp2(v, OP_Close, iCur+i+1, 0);
    }
  }
  sqlite3VdbeAddOp2(v, OP_Close, iCur, 0);

  /* Update the sqlite_sequence table by storing the content of the
  ** maximum rowid counter values recorded while inserting into
  ** autoincrement tables.
  */
  if( pParse->nested==0 && pParse->pTriggerTab==0 ){
    sqlite3AutoincrementEnd(pParse);
  }

  /*
  ** Return the number of rows that were changed. If this routine is 
  ** generating code because of a call to sqlite3NestedParse(), do not
  ** invoke the callback function.
  */
  if( (db->flags&SQLITE_CountRows) && !pParse->pTriggerTab && !pParse->nested ){
    sqlite3VdbeAddOp2(v, OP_ResultRow, regRowCount, 1);
    sqlite3VdbeSetNumCols(v, 1);
    sqlite3VdbeSetColName(v, 0, COLNAME_NAME, "rows updated", SQLITE_STATIC);
  }

update_cleanup:
  sqlite3AuthContextPop(&sContext);
  sqlite3DbFree(db, aRegIdx);
  sqlite3DbFree(db, aXRef);
  sqlite3SrcListDelete(db, pTabList);
  sqlite3ExprListDelete(db, pChanges);
  sqlite3ExprDelete(db, pWhere);
  return;
}